

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tap.c
# Opt level: O2

int diag(char *fmt,...)

{
  char cVar1;
  char *pcVar2;
  char in_AL;
  char *__ptr;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  char *pcVar3;
  undefined8 in_R8;
  undefined8 in_R9;
  char *pcVar4;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  __va_list_tag local_f8;
  undefined1 local_d8 [8];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  local_f8.reg_save_area = local_d8;
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_f8.overflow_arg_area = &args[0].overflow_arg_area;
  local_f8.gp_offset = 8;
  local_f8.fp_offset = 0x30;
  if (fmt != (char *)0x0) {
    local_d0 = in_RSI;
    local_c8 = in_RDX;
    local_c0 = in_RCX;
    local_b8 = in_R8;
    local_b0 = in_R9;
    __ptr = vstrdupf(fmt,&local_f8);
    pcVar3 = __ptr;
    pcVar4 = __ptr;
    while (pcVar2 = pcVar4, pcVar4 = pcVar2 + 1, *pcVar3 != '\0') {
      cVar1 = *pcVar2;
      if ((cVar1 == '\n') || (cVar1 == '\0')) {
        *pcVar2 = '\0';
        printf("# %s\n");
        if (cVar1 == '\0') break;
        *pcVar2 = cVar1;
        pcVar3 = pcVar4;
      }
    }
    free(__ptr);
  }
  return 0;
}

Assistant:

int
diag (const char *fmt, ...) {
    va_list args;
    char *mesg, *line;
    int i;
    va_start(args, fmt);
    if (!fmt) {
        va_end(args);
        return 0;
    }
    mesg = vstrdupf(fmt, args);
    line = mesg;
    for (i = 0; *line; i++) {
        char c = mesg[i];
        if (!c || c == '\n') {
            mesg[i] = '\0';
            printf("# %s\n", line);
            if (!c)
                break;
            mesg[i] = c;
            line = mesg + i + 1;
        }
    }
    free(mesg);
    va_end(args);
    return 0;
}